

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bpacking.cpp
# Opt level: O1

uint32_t * unpack5_16(uint32_t base,uint32_t *in,uint32_t *out)

{
  uint uVar1;
  
  *out = (*in & 0x1f) + base;
  out[1] = (*in >> 5 & 0x1f) + base;
  out[2] = (*in >> 10 & 0x1f) + base;
  out[3] = (*in >> 0xf & 0x1f) + base;
  out[4] = (*in >> 0x14 & 0x1f) + base;
  out[5] = (*in >> 0x19 & 0x1f) + base;
  uVar1 = *in;
  out[6] = uVar1 >> 0x1e;
  out[6] = (uVar1 >> 0x1e) + base + (in[1] & 7) * 4;
  out[7] = (in[1] >> 3 & 0x1f) + base;
  out[8] = (in[1] >> 8 & 0x1f) + base;
  out[9] = (in[1] >> 0xd & 0x1f) + base;
  out[10] = (in[1] >> 0x12 & 0x1f) + base;
  out[0xb] = (in[1] >> 0x17 & 0x1f) + base;
  uVar1 = in[1];
  out[0xc] = uVar1 >> 0x1c;
  out[0xc] = (uVar1 >> 0x1c) + base + (in[2] & 1) * 0x10;
  out[0xd] = (in[2] >> 1 & 0x1f) + base;
  out[0xe] = (in[2] >> 6 & 0x1f) + base;
  out[0xf] = (in[2] >> 0xb & 0x1f) + base;
  return in + 3;
}

Assistant:

uint32_t * unpack5_16( uint32_t base,  uint32_t *   in, uint32_t *    out) {

    *out = ( (*in) >>  0  )   % (1U << 5 )  ;
    *out += base;
    out++;
    *out = ( (*in) >>  5  )   % (1U << 5 )  ;
    *out += base;
    out++;
    *out = ( (*in) >>  10  )   % (1U << 5 )  ;
    *out += base;
    out++;
    *out = ( (*in) >>  15  )   % (1U << 5 )  ;
    *out += base;
    out++;
    *out = ( (*in) >>  20  )   % (1U << 5 )  ;
    *out += base;
    out++;
    *out = ( (*in) >>  25  )   % (1U << 5 )  ;
    *out += base;
    out++;
    *out = ( (*in) >>  30  ) ;
    ++in;
    *out |= ((*in) % (1U<< 3 ))<<( 5 - 3 );
    *out += base;
    out++;
    *out = ( (*in) >>  3  )   % (1U << 5 )  ;
    *out += base;
    out++;
    *out = ( (*in) >>  8  )   % (1U << 5 )  ;
    *out += base;
    out++;
    *out = ( (*in) >>  13  )   % (1U << 5 )  ;
    *out += base;
    out++;
    *out = ( (*in) >>  18  )   % (1U << 5 )  ;
    *out += base;
    out++;
    *out = ( (*in) >>  23  )   % (1U << 5 )  ;
    *out += base;
    out++;
    *out = ( (*in) >>  28  ) ;
    ++in;
    *out |= ((*in) % (1U<< 1 ))<<( 5 - 1 );
    *out += base;
    out++;
    *out = ( (*in) >>  1  )   % (1U << 5 )  ;
    *out += base;
    out++;
    *out = ( (*in) >>  6  )   % (1U << 5 )  ;
    *out += base;
    out++;
    *out = ( (*in) >>  11  )   % (1U << 5 )  ;
    *out += base;
    out++;

    return in + 1;
}